

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O1

bool __thiscall RoboClaw::ReadMinMaxMainVoltages(RoboClaw *this,uint16_t *min,uint16_t *max)

{
  uint32_t uVar1;
  bool valid;
  bool local_19;
  
  uVar1 = Read4(this,this->m_address,';',&local_19);
  if (local_19 == true) {
    *min = (uint16_t)(uVar1 >> 0x10);
    *max = (uint16_t)uVar1;
  }
  return local_19;
}

Assistant:

bool RoboClaw::ReadMinMaxMainVoltages( uint16_t &min,uint16_t &max)
{
    bool valid;
    uint32_t value = Read4( m_address, GETMINMAXMAINVOLTAGES,&valid);
    if(valid)
    {
        min = value>>16;
        max = value&0xFFFF;
    }
    return valid;
}